

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderLang.cpp
# Opt level: O2

bool anon_unknown.dwarf_b14be0::CompileDeferred
               (TCompiler *compiler,char **shaderStrings,int numStrings,int *inputLengths,
               char **stringNames,char *preamble,EShOptimizationLevel optLevel,
               TBuiltInResource *resources,int defaultVersion,EProfile defaultProfile,
               bool forceDefaultVersionAndProfile,int overrideVersion,bool forwardCompatible,
               EShMessages messages,TIntermediate *intermediate,Includer *includer,
               string sourceEntryPointName,TEnvironment *environment,bool compileOnly)

{
  int *piVar1;
  TSymbolTable *symTable;
  TInfoSink *pTVar2;
  SpvVersion spvVersion_00;
  string sourceEntryPointName_00;
  EProfile profile_00;
  EShMessages EVar3;
  _Head_base<0UL,_const_char_**,_false> _Var4;
  TCompiler *pTVar5;
  _Head_base<0UL,_const_char_**,_false> s_00;
  _Head_base<0UL,_unsigned_long_*,_false> L;
  EShLanguage language;
  EShSource source;
  bool versionNotFirst;
  bool bVar6;
  int s;
  uint uVar7;
  int iVar8;
  TPoolAllocator *this;
  size_t sVar9;
  ulong uVar10;
  undefined8 extraout_RAX;
  char *pcVar11;
  __uniq_ptr_data<glslang::TSymbolTable,_std::default_delete<glslang::TSymbolTable>,_true,_true>
  this_00;
  TParseContextBase *pc;
  TInfoSinkBase *pTVar12;
  int s_2;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  bool bVar16;
  bool bVar17;
  undefined1 auStack_658 [11];
  bool versionNotFirstToken;
  EProfile profile;
  int version;
  undefined4 uStack_644;
  EShMessages local_640;
  EShMessages local_63c;
  uint local_638;
  EShMessages local_634;
  _Head_base<0UL,_const_char_**,_false> local_630;
  TCompiler *local_628;
  int postIndex;
  _Head_base<0UL,_const_char_**,_false> local_618;
  _Head_base<0UL,_unsigned_long_*,_false> local_610;
  SpvVersion spvVersion;
  EShLanguage stage;
  ulong local_5d0;
  char *local_5c8;
  unique_ptr<glslang::TSymbolTable,_std::default_delete<glslang::TSymbolTable>_> symbolTable;
  unique_ptr<const_char_*[],_std::default_delete<const_char_*[]>_> names;
  unique_ptr<const_char_*[],_std::default_delete<const_char_*[]>_> strings;
  unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_> lengths;
  EShSource sourceGuess;
  SpvVersion local_598;
  string local_578;
  string preamble_1;
  TSourceLoc loc;
  string local_4d0 [32];
  TInputScanner userInput;
  TScanContext scanContext;
  TPpContext ppContext;
  
  local_5c8 = preamble;
  std::__cxx11::string::string((string *)&local_578,(string *)sourceEntryPointName._M_dataplus._M_p)
  ;
  local_63c = messages;
  this = glslang::GetThreadPoolAllocator();
  glslang::TPoolAllocator::push(this);
  if (numStrings == 0) {
    bVar16 = true;
  }
  else {
    local_5d0 = (ulong)(numStrings + 3);
    uVar15 = 0xffffffffffffffff;
    if (-4 < numStrings) {
      uVar15 = local_5d0 * 8;
    }
    local_628 = compiler;
    local_610._M_head_impl = (unsigned_long *)operator_new__(uVar15);
    lengths._M_t.super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
    super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
         (__uniq_ptr_data<unsigned_long,_std::default_delete<unsigned_long[]>,_true,_true>)
         (__uniq_ptr_data<unsigned_long,_std::default_delete<unsigned_long[]>,_true,_true>)
         local_610._M_head_impl;
    local_618._M_head_impl = (char **)operator_new__(uVar15);
    strings._M_t.super___uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_>._M_t.
    super__Tuple_impl<0UL,_const_char_**,_std::default_delete<const_char_*[]>_>.
    super__Head_base<0UL,_const_char_**,_false>._M_head_impl =
         (__uniq_ptr_data<const_char_*,_std::default_delete<const_char_*[]>,_true,_true>)
         (__uniq_ptr_data<const_char_*,_std::default_delete<const_char_*[]>,_true,_true>)
         local_618._M_head_impl;
    local_630._M_head_impl = (char **)operator_new__(uVar15);
    lVar14 = 0;
    uVar15 = 0;
    if (0 < numStrings) {
      uVar15 = (ulong)(uint)numStrings;
    }
    _postIndex = (ulong)(uint)numStrings;
    names._M_t.super___uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_>._M_t.
    super__Tuple_impl<0UL,_const_char_**,_std::default_delete<const_char_*[]>_>.
    super__Head_base<0UL,_const_char_**,_false>._M_head_impl =
         (__uniq_ptr_data<const_char_*,_std::default_delete<const_char_*[]>,_true,_true>)
         (__uniq_ptr_data<const_char_*,_std::default_delete<const_char_*[]>,_true,_true>)
         local_630._M_head_impl;
    for (; pTVar5 = local_628, uVar15 * 4 - lVar14 != 0; lVar14 = lVar14 + 4) {
      pcVar11 = *(char **)((long)shaderStrings + lVar14 * 2);
      *(char **)((long)local_618._M_head_impl + lVar14 * 2 + 0x10) = pcVar11;
      if ((inputLengths == (int *)0x0) ||
         (sVar9 = (size_t)*(int *)((long)inputLengths + lVar14), (long)sVar9 < 0)) {
        sVar9 = strlen(pcVar11);
      }
      *(size_t *)((long)local_610._M_head_impl + lVar14 * 2 + 0x10) = sVar9;
    }
    uVar10 = 0;
    if (stringNames == (char **)0x0) {
      for (; uVar15 != uVar10; uVar10 = uVar10 + 1) {
        local_630._M_head_impl[uVar10 + 2] = (char *)0x0;
      }
    }
    else {
      for (; uVar15 != uVar10; uVar10 = uVar10 + 1) {
        local_630._M_head_impl[uVar10 + 2] = stringNames[uVar10];
      }
    }
    sourceGuess = EShSourceHlsl - ((messages & EShMsgReadHlsl) == EShMsgDefault);
    spvVersion.spv = 0;
    spvVersion.vulkanGlsl = 0;
    spvVersion.vulkan = 0;
    spvVersion.openGl = 0;
    spvVersion._16_4_ = spvVersion._16_4_ & 0xffffff00;
    stage = local_628->language;
    TranslateEnvironment
              ((TEnvironment *)sourceEntryPointName._M_string_length,&local_63c,&sourceGuess,&stage,
               &spvVersion);
    source = sourceGuess;
    if ((sourceEntryPointName._M_string_length != 0) &&
       (*(char *)(sourceEntryPointName._M_string_length + 0x24) == '\x01')) {
      intermediate->hlslFunctionality1 = true;
    }
    bVar17 = false;
    glslang::TInputScanner::TInputScanner
              (&userInput,(int)_postIndex,local_618._M_head_impl + 0x10,local_610._M_head_impl + 2,
               (char **)0x0,0,0,false);
    version = 0;
    profile = ENoProfile;
    versionNotFirstToken = false;
    local_638 = (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
    bVar16 = true;
    versionNotFirst = true;
    if (source != EShSourceHlsl) {
      versionNotFirst =
           glslang::TInputScanner::scanVersion(&userInput,&version,&profile,&versionNotFirstToken);
      bVar16 = version == 0;
      bVar17 = source == EShSourceGlsl;
      if (forceDefaultVersionAndProfile && bVar17) {
        if ((local_63c & EShMsgSuppressWarnings) == EShMsgDefault && version != 0) {
          if ((version != defaultVersion) || (profile != defaultProfile)) {
            pTVar2 = pTVar5->infoSink;
            glslang::TInfoSinkBase::append
                      (&pTVar2->info,"Warning, (version, profile) forced to be (");
            pTVar12 = glslang::TInfoSinkBase::operator<<(&pTVar2->info,defaultVersion);
            glslang::TInfoSinkBase::append(pTVar12,", ");
            pcVar11 = glslang::ProfileName(defaultProfile);
            glslang::TInfoSinkBase::append(pTVar12,pcVar11);
            glslang::TInfoSinkBase::append(pTVar12,"), while in source code it is (");
            pTVar12 = glslang::TInfoSinkBase::operator<<(pTVar12,version);
            glslang::TInfoSinkBase::append(pTVar12,", ");
            pcVar11 = glslang::ProfileName(profile);
            glslang::TInfoSinkBase::append(pTVar12,pcVar11);
            glslang::TInfoSinkBase::append(pTVar12,")\n");
          }
        }
        else if (version == 0) {
          versionNotFirstToken = false;
          versionNotFirst = false;
        }
        version = defaultVersion;
        profile = defaultProfile;
        bVar16 = false;
      }
      if (overrideVersion != 0 && source == EShSourceGlsl) {
        version = overrideVersion;
        bVar17 = true;
      }
    }
    language = stage;
    uVar10 = (ulong)stage;
    bVar6 = DeduceVersionProfile
                      (pTVar5->infoSink,stage,versionNotFirst,defaultVersion,source,&version,
                       &profile,&spvVersion);
    _Var4._M_head_impl = local_630._M_head_impl;
    uStack_644 = CONCAT13(bVar6,(undefined3)uStack_644);
    if ((bVar16) || ((versionNotFirst & (299 < version && profile == EEsProfile)) != 0)) {
      local_640 = EShMsgDefault;
    }
    else if (versionNotFirstToken == true) {
      local_640 = local_63c & EShMsgRelaxedErrors;
      local_638 = (uint)(local_640 == EShMsgDefault);
    }
    else {
      local_638 = 0;
      local_640 = EShMsgDefault;
    }
    intermediate->source = source;
    intermediate->version = version;
    intermediate->profile = profile;
    glslang::TIntermediate::setSpv(intermediate,&spvVersion);
    EVar3 = local_63c;
    RecordProcesses(intermediate,local_63c,&local_578);
    if (0 < spvVersion.vulkan) {
      intermediate->originUpperLeft = true;
    }
    if (source == EShSourceHlsl || (EVar3 >> 9 & 1) != 0) {
      glslang::TIntermediate::setHlslOffsets(intermediate);
    }
    local_634 = EVar3;
    if ((EVar3 >> 10 & 1) != 0) {
      glslang::TIntermediate::setSourceFile(intermediate,_Var4._M_head_impl[2]);
      for (uVar13 = 0; uVar15 != uVar13; uVar13 = uVar13 + 1) {
        std::__cxx11::string::append
                  ((char *)&intermediate->sourceText,(ulong)local_618._M_head_impl[uVar13 + 2]);
      }
    }
    bVar16 = SetupBuiltinSymbolTable(version,profile,&spvVersion,source);
    if (bVar16) {
      uVar7 = MapVersionToIndex(version);
      if (spvVersion.openGl < 1) {
        if (spvVersion.vulkan < 1) {
          uVar15 = 0;
        }
        else {
          uVar15 = (ulong)spvVersion.vulkanRelaxed | 2;
        }
      }
      else {
        uVar15 = 1;
      }
      if (profile - ECoreProfile < 7) {
        lVar14 = *(long *)(&DAT_00721de0 + (ulong)(profile - ECoreProfile) * 8);
      }
      else {
        lVar14 = 0;
      }
      symTable = (TSymbolTable *)
                 (&(anonymous_namespace)::SharedSymbolTables)
                 [uVar15 * 0x70 +
                  lVar14 * 0x1c +
                  (ulong)(source == EShSourceHlsl) * 0xe + (ulong)uVar7 * 0x1c0 + uVar10];
      this_00.
      super___uniq_ptr_impl<glslang::TSymbolTable,_std::default_delete<glslang::TSymbolTable>_>._M_t
      .super__Tuple_impl<0UL,_glslang::TSymbolTable_*,_std::default_delete<glslang::TSymbolTable>_>.
      super__Head_base<0UL,_glslang::TSymbolTable_*,_false>._M_head_impl =
           (__uniq_ptr_impl<glslang::TSymbolTable,_std::default_delete<glslang::TSymbolTable>_>)
           ::operator_new(0x28);
      *(uint *)((long)this_00.
                      super___uniq_ptr_impl<glslang::TSymbolTable,_std::default_delete<glslang::TSymbolTable>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_glslang::TSymbolTable_*,_std::default_delete<glslang::TSymbolTable>_>
                      .super__Head_base<0UL,_glslang::TSymbolTable_*,_false>._M_head_impl + 0x24) =
           0;
      *(undefined2 *)
       ((long)this_00.
              super___uniq_ptr_impl<glslang::TSymbolTable,_std::default_delete<glslang::TSymbolTable>_>
              ._M_t.
              super__Tuple_impl<0UL,_glslang::TSymbolTable_*,_std::default_delete<glslang::TSymbolTable>_>
              .super__Head_base<0UL,_glslang::TSymbolTable_*,_false>._M_head_impl + 0x20) = 0;
      *(undefined8 *)
       this_00.
       super___uniq_ptr_impl<glslang::TSymbolTable,_std::default_delete<glslang::TSymbolTable>_>.
       _M_t.
       super__Tuple_impl<0UL,_glslang::TSymbolTable_*,_std::default_delete<glslang::TSymbolTable>_>.
       super__Head_base<0UL,_glslang::TSymbolTable_*,_false>._M_head_impl = 0;
      *(pointer *)
       ((long)this_00.
              super___uniq_ptr_impl<glslang::TSymbolTable,_std::default_delete<glslang::TSymbolTable>_>
              ._M_t.
              super__Tuple_impl<0UL,_glslang::TSymbolTable_*,_std::default_delete<glslang::TSymbolTable>_>
              .super__Head_base<0UL,_glslang::TSymbolTable_*,_false>._M_head_impl + 8) =
           (pointer)0x0;
      *(pointer *)
       ((long)this_00.
              super___uniq_ptr_impl<glslang::TSymbolTable,_std::default_delete<glslang::TSymbolTable>_>
              ._M_t.
              super__Tuple_impl<0UL,_glslang::TSymbolTable_*,_std::default_delete<glslang::TSymbolTable>_>
              .super__Head_base<0UL,_glslang::TSymbolTable_*,_false>._M_head_impl + 0x10) =
           (pointer)0x0;
      *(longlong *)
       ((long)this_00.
              super___uniq_ptr_impl<glslang::TSymbolTable,_std::default_delete<glslang::TSymbolTable>_>
              ._M_t.
              super__Tuple_impl<0UL,_glslang::TSymbolTable_*,_std::default_delete<glslang::TSymbolTable>_>
              .super__Head_base<0UL,_glslang::TSymbolTable_*,_false>._M_head_impl + 0x18) = 0;
      symbolTable._M_t.
      super___uniq_ptr_impl<glslang::TSymbolTable,_std::default_delete<glslang::TSymbolTable>_>._M_t
      .super__Tuple_impl<0UL,_glslang::TSymbolTable_*,_std::default_delete<glslang::TSymbolTable>_>.
      super__Head_base<0UL,_glslang::TSymbolTable_*,_false>._M_head_impl =
           (__uniq_ptr_data<glslang::TSymbolTable,_std::default_delete<glslang::TSymbolTable>,_true,_true>
            )(__uniq_ptr_data<glslang::TSymbolTable,_std::default_delete<glslang::TSymbolTable>,_true,_true>
              )this_00.
               super___uniq_ptr_impl<glslang::TSymbolTable,_std::default_delete<glslang::TSymbolTable>_>
               ._M_t.
               super__Tuple_impl<0UL,_glslang::TSymbolTable_*,_std::default_delete<glslang::TSymbolTable>_>
               .super__Head_base<0UL,_glslang::TSymbolTable_*,_false>._M_head_impl;
      if (symTable != (TSymbolTable *)0x0) {
        glslang::TSymbolTable::adoptLevels
                  ((TSymbolTable *)
                   this_00.
                   super___uniq_ptr_impl<glslang::TSymbolTable,_std::default_delete<glslang::TSymbolTable>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_glslang::TSymbolTable_*,_std::default_delete<glslang::TSymbolTable>_>
                   .super__Head_base<0UL,_glslang::TSymbolTable_*,_false>._M_head_impl,symTable);
      }
      if (intermediate->uniqueId != 0) {
        *(unsigned_long_long *)
         ((long)this_00.
                super___uniq_ptr_impl<glslang::TSymbolTable,_std::default_delete<glslang::TSymbolTable>_>
                ._M_t.
                super__Tuple_impl<0UL,_glslang::TSymbolTable_*,_std::default_delete<glslang::TSymbolTable>_>
                .super__Head_base<0UL,_glslang::TSymbolTable_*,_false>._M_head_impl + 0x18) =
             intermediate->uniqueId;
        glslang::TSymbolTable::updateUniqueIdLevelFlag
                  ((TSymbolTable *)
                   this_00.
                   super___uniq_ptr_impl<glslang::TSymbolTable,_std::default_delete<glslang::TSymbolTable>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_glslang::TSymbolTable_*,_std::default_delete<glslang::TSymbolTable>_>
                   .super__Head_base<0UL,_glslang::TSymbolTable_*,_false>._M_head_impl);
      }
      bVar16 = AddContextSpecificSymbols
                         (resources,local_628->infoSink,
                          (TSymbolTable *)
                          this_00.
                          super___uniq_ptr_impl<glslang::TSymbolTable,_std::default_delete<glslang::TSymbolTable>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_glslang::TSymbolTable_*,_std::default_delete<glslang::TSymbolTable>_>
                          .super__Head_base<0UL,_glslang::TSymbolTable_*,_false>._M_head_impl,
                          version,profile,&spvVersion,language,source);
      if (bVar16) {
        if ((local_634 >> 0xe & 1) != 0) {
          DumpBuiltinSymbolTable
                    (local_628->infoSink,
                     (TSymbolTable *)
                     this_00.
                     super___uniq_ptr_impl<glslang::TSymbolTable,_std::default_delete<glslang::TSymbolTable>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_glslang::TSymbolTable_*,_std::default_delete<glslang::TSymbolTable>_>
                     .super__Head_base<0UL,_glslang::TSymbolTable_*,_false>._M_head_impl);
        }
        iVar8 = version;
        profile_00 = profile;
        pTVar2 = local_628->infoSink;
        local_598.spv = spvVersion.spv;
        local_598.vulkanGlsl = spvVersion.vulkanGlsl;
        local_598.vulkan = spvVersion.vulkan;
        local_598.openGl = spvVersion.openGl;
        local_598.vulkanRelaxed = spvVersion.vulkanRelaxed;
        local_598._17_3_ = spvVersion._17_3_;
        std::__cxx11::string::string(local_4d0,(string *)&local_578);
        spvVersion_00.vulkan = local_598.vulkan;
        spvVersion_00.openGl = local_598.openGl;
        spvVersion_00.spv = local_598.spv;
        spvVersion_00.vulkanGlsl = local_598.vulkanGlsl;
        spvVersion_00.vulkanRelaxed = local_598.vulkanRelaxed;
        spvVersion_00._17_3_ = local_598._17_3_;
        sourceEntryPointName_00._8_11_ = auStack_658;
        sourceEntryPointName_00._M_dataplus._M_p = (pointer)local_4d0;
        sourceEntryPointName_00.field_2._M_local_buf[3] = versionNotFirstToken;
        sourceEntryPointName_00.field_2._M_allocated_capacity._4_4_ = profile;
        sourceEntryPointName_00.field_2._8_4_ = version;
        sourceEntryPointName_00.field_2._12_4_ = uStack_644;
        pc = CreateParseContext((TSymbolTable *)
                                this_00.
                                super___uniq_ptr_impl<glslang::TSymbolTable,_std::default_delete<glslang::TSymbolTable>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_glslang::TSymbolTable_*,_std::default_delete<glslang::TSymbolTable>_>
                                .super__Head_base<0UL,_glslang::TSymbolTable_*,_false>._M_head_impl,
                                intermediate,iVar8,profile_00,source,language,pTVar2,spvVersion_00,
                                forwardCompatible,local_634,false,sourceEntryPointName_00);
        std::__cxx11::string::_M_dispose();
        pc->compileOnly = (bool)sourceEntryPointName.field_2._M_local_buf[0];
        pcVar11 = "";
        if (local_630._M_head_impl[2] != (char *)0x0) {
          pcVar11 = local_630._M_head_impl[2];
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&loc,pcVar11,(allocator<char> *)&scanContext);
        glslang::TPpContext::TPpContext(&ppContext,pc,(string *)&loc,includer);
        std::__cxx11::string::_M_dispose();
        scanContext._vptr_TScanContext = (_func_int **)&PTR__TScanContext_00a5afe0;
        scanContext.afterType = false;
        scanContext.afterStruct = false;
        scanContext.field = false;
        scanContext.afterBuffer = false;
        if (bVar17) {
          pc->scanContext = &scanContext;
        }
        pc->ppContext = &ppContext;
        scanContext.parseContext = pc;
        (*(pc->super_TParseVersions)._vptr_TParseVersions[0x31])(pc,resources);
        if (uStack_644._3_1_ == '\0') {
          piVar1 = &(pc->super_TParseVersions).numErrors;
          *piVar1 = *piVar1 + 1;
        }
        _postIndex = (ulong)((int)_postIndex + 2);
        if ((undefined1)local_640 != '\0') {
          loc.name = (TString *)0x0;
          loc.string = 0;
          loc.line = 0;
          loc.column = 0;
          (*(pc->super_TParseVersions)._vptr_TParseVersions[0x2e])
                    (pc,&loc,"Illegal to have non-comment, non-whitespace tokens before #version",
                     "#version","");
        }
        (*(pc->super_TParseVersions)._vptr_TParseVersions[2])(pc);
        preamble_1._M_dataplus._M_p = (pointer)&preamble_1.field_2;
        preamble_1._M_string_length = 0;
        preamble_1.field_2._M_local_buf[0] = '\0';
        glslang::TParseVersions::getPreamble(&pc->super_TParseVersions,&preamble_1);
        s_00._M_head_impl = local_618._M_head_impl;
        *local_618._M_head_impl = preamble_1._M_dataplus._M_p;
        sVar9 = strlen(preamble_1._M_dataplus._M_p);
        L._M_head_impl = local_610._M_head_impl;
        _Var4._M_head_impl = local_630._M_head_impl;
        *local_610._M_head_impl = sVar9;
        *local_630._M_head_impl = (char *)0x0;
        s_00._M_head_impl[1] = local_5c8;
        sVar9 = strlen(local_5c8);
        _Var4._M_head_impl[1] = (char *)0x0;
        L._M_head_impl[1] = sVar9;
        lVar14 = (long)postIndex;
        s_00._M_head_impl[lVar14] = "\n int;";
        L._M_head_impl[lVar14] = 6;
        _Var4._M_head_impl[lVar14] = (char *)0x0;
        glslang::TInputScanner::TInputScanner
                  ((TInputScanner *)&loc,(int)local_5d0,s_00._M_head_impl,L._M_head_impl,
                   _Var4._M_head_impl,2,1,false);
        glslang::TSymbolTable::push
                  ((TSymbolTable *)
                   this_00.
                   super___uniq_ptr_impl<glslang::TSymbolTable,_std::default_delete<glslang::TSymbolTable>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_glslang::TSymbolTable_*,_std::default_delete<glslang::TSymbolTable>_>
                   .super__Head_base<0UL,_glslang::TSymbolTable_*,_false>._M_head_impl);
        iVar8 = (*(pc->super_TParseVersions)._vptr_TParseVersions[0x3b])
                          (pc,&ppContext,&loc,(ulong)(byte)local_638);
        if ((char)iVar8 == '\0') {
          glslang::TInfoSinkBase::append(&((pc->super_TParseVersions).infoSink)->info,"ERROR: ");
          pTVar12 = glslang::TInfoSinkBase::operator<<
                              (&((pc->super_TParseVersions).infoSink)->info,
                               (pc->super_TParseVersions).numErrors);
          glslang::TInfoSinkBase::append(pTVar12," compilation errors.  No code generated.\n\n");
          bVar16 = false;
        }
        else {
          bVar16 = true;
          if (intermediate->treeRoot != (TIntermNode *)0x0) {
            if (optLevel == EShOptNoGeneration) {
              glslang::TInfoSinkBase::message
                        (&((pc->super_TParseVersions).infoSink)->info,EPrefixNone,
                         "No errors.  No code generation or linking was requested.");
            }
            else {
              bVar16 = glslang::TIntermediate::postProcess
                                 (intermediate,intermediate->treeRoot,
                                  (pc->super_TParseVersions).language);
            }
          }
        }
        if ((local_634 & EShMsgAST) != EShMsgDefault) {
          glslang::TIntermediate::output(intermediate,(pc->super_TParseVersions).infoSink,true);
        }
        intermediate->uniqueId =
             *(longlong *)
              ((long)this_00.
                     super___uniq_ptr_impl<glslang::TSymbolTable,_std::default_delete<glslang::TSymbolTable>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_glslang::TSymbolTable_*,_std::default_delete<glslang::TSymbolTable>_>
                     .super__Head_base<0UL,_glslang::TSymbolTable_*,_false>._M_head_impl + 0x18);
        glslang::TInputScanner::~TInputScanner((TInputScanner *)&loc);
        std::__cxx11::string::_M_dispose();
        glslang::TPpContext::~TPpContext(&ppContext);
        (*(pc->super_TParseVersions)._vptr_TParseVersions[1])(pc);
      }
      else {
        bVar16 = false;
      }
      std::unique_ptr<glslang::TSymbolTable,_std::default_delete<glslang::TSymbolTable>_>::
      ~unique_ptr(&symbolTable);
    }
    else {
      bVar16 = false;
    }
    glslang::TInputScanner::~TInputScanner(&userInput);
    std::unique_ptr<const_char_*[],_std::default_delete<const_char_*[]>_>::~unique_ptr(&names);
    std::unique_ptr<const_char_*[],_std::default_delete<const_char_*[]>_>::~unique_ptr(&strings);
    std::unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>::~unique_ptr(&lengths);
  }
  std::__cxx11::string::_M_dispose();
  return bVar16;
}

Assistant:

bool CompileDeferred(
    TCompiler* compiler,
    const char* const shaderStrings[],
    const int numStrings,
    const int* inputLengths,
    const char* const stringNames[],
    const char* preamble,
    const EShOptimizationLevel optLevel,
    const TBuiltInResource* resources,
    int defaultVersion,         // use 100 for ES environment, 110 for desktop
    EProfile defaultProfile,
    bool forceDefaultVersionAndProfile,
    int overrideVersion,        // use 0 if not overriding GLSL version
    bool forwardCompatible,     // give errors for use of deprecated features
    EShMessages messages,       // warnings/errors/AST; things to print out
    TIntermediate& intermediate,// returned tree, etc.
    TShader::Includer& includer,
    const std::string sourceEntryPointName = "",
    TEnvironment* environment = nullptr,
    bool compileOnly = false)
{
    DoFullParse parser;
    return ProcessDeferred(compiler, shaderStrings, numStrings, inputLengths, stringNames,
                           preamble, optLevel, resources, defaultVersion,
                           defaultProfile, forceDefaultVersionAndProfile, overrideVersion,
                           forwardCompatible, messages, intermediate, parser,
                           true, includer, sourceEntryPointName, environment, compileOnly);
}